

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O2

int glu::getNumDepthBits(TextureFormat *format)

{
  TextureFormat depthOnlyFormat;
  TextureFormat local_20;
  int local_18 [4];
  
  if (format->order != D) {
    if (format->order != DS) {
      return 0;
    }
    local_20 = tcu::getEffectiveDepthStencilTextureFormat(format,MODE_DEPTH);
    format = &local_20;
  }
  tcu::getTextureFormatBitDepth((tcu *)local_18,format);
  return local_18[0];
}

Assistant:

static int getNumDepthBits (const tcu::TextureFormat& format)
{
	if (format.order == tcu::TextureFormat::DS)
	{
		const tcu::TextureFormat	depthOnlyFormat		= tcu::getEffectiveDepthStencilTextureFormat(format, tcu::Sampler::MODE_DEPTH);
		return tcu::getTextureFormatBitDepth(depthOnlyFormat).x();
	}
	else if (format.order == tcu::TextureFormat::D)
		return tcu::getTextureFormatBitDepth(format).x();
	else
		return 0;
}